

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.hpp
# Opt level: O3

void __thiscall
libtorrent::aux::session_impl::send_udp_packet_listen
          (session_impl *this,listen_socket_handle *sock,endpoint *ep,span<const_char> p,
          error_code *ec,udp_send_flags_t flags)

{
  int *piVar1;
  _Atomic_word *p_Var2;
  int iVar3;
  listen_socket_t *plVar4;
  __weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2> local_50;
  __weak_ptr<libtorrent::aux::utp_socket_interface,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  long *local_38;
  
  plVar4 = listen_socket_handle::get(sock);
  if (plVar4 == (listen_socket_t *)0x0) {
    ec->val_ = 9;
    ec->failed_ = true;
    *(undefined3 *)&ec->field_0x5 = 0;
    ec->cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                super_error_category;
  }
  else {
    local_50._M_ptr =
         (sock->m_sock).
         super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_50._M_refcount._M_pi =
         (sock->m_sock).
         super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (local_50._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_50._M_refcount._M_pi)->_M_weak_count =
             (local_50._M_refcount._M_pi)->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        (local_50._M_refcount._M_pi)->_M_weak_count =
             (local_50._M_refcount._M_pi)->_M_weak_count + 1;
      }
    }
    ::std::__weak_ptr<libtorrent::aux::utp_socket_interface,(__gnu_cxx::_Lock_policy)2>::
    __weak_ptr<libtorrent::aux::listen_socket_t,void>(local_40,&local_50);
    send_udp_packet(this,(weak_ptr<libtorrent::aux::utp_socket_interface> *)local_40,ep,p,ec,flags);
    if (local_38 != (long *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)((long)local_38 + 0xc);
        iVar3 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar3 = *(int *)((long)local_38 + 0xc);
        *(int *)((long)local_38 + 0xc) = iVar3 + -1;
      }
      if (iVar3 == 1) {
        (**(code **)(*local_38 + 0x18))();
      }
    }
    if (local_50._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2 = &(local_50._M_refcount._M_pi)->_M_weak_count;
        iVar3 = *p_Var2;
        *p_Var2 = *p_Var2 + -1;
        UNLOCK();
      }
      else {
        iVar3 = (local_50._M_refcount._M_pi)->_M_weak_count;
        (local_50._M_refcount._M_pi)->_M_weak_count = iVar3 + -1;
      }
      if (iVar3 == 1) {
        (*(local_50._M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
      }
    }
  }
  return;
}

Assistant:

void send_udp_packet_listen(aux::listen_socket_handle const& sock
				, udp::endpoint const& ep
				, span<char const> p
				, error_code& ec
				, udp_send_flags_t const flags)
			{
				listen_socket_t* s = sock.get();
				if (!s)
				{
					ec = boost::asio::error::bad_descriptor;
					return;
				}
				send_udp_packet(sock.get_ptr(), ep, p, ec, flags);
			}